

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O0

uint32_t BinarySpectrumFloat(float *spectrum,SpectrumType *threshold_spectrum,
                            int *threshold_initialized)

{
  uint32_t local_28;
  float kScale;
  uint32_t out;
  int i;
  int *threshold_initialized_local;
  SpectrumType *threshold_spectrum_local;
  float *spectrum_local;
  
  local_28 = 0;
  if (*threshold_initialized == 0) {
    for (kScale = 1.68156e-44; (int)kScale < 0x2c; kScale = (float)((int)kScale + 1)) {
      if (0.0 < spectrum[(int)kScale]) {
        threshold_spectrum[(int)kScale].float_ = spectrum[(int)kScale] / 2.0;
        *threshold_initialized = 1;
      }
    }
  }
  for (kScale = 1.68156e-44; (int)kScale < 0x2c; kScale = (float)((int)kScale + 1)) {
    MeanEstimatorFloat(spectrum[(int)kScale],0.015625,&threshold_spectrum[(int)kScale].float_);
    if (threshold_spectrum[(int)kScale].float_ <= spectrum[(int)kScale] &&
        spectrum[(int)kScale] != threshold_spectrum[(int)kScale].float_) {
      local_28 = SetBit(local_28,(int)kScale + -0xc);
    }
  }
  return local_28;
}

Assistant:

static uint32_t BinarySpectrumFloat(const float* spectrum,
                                    SpectrumType* threshold_spectrum,
                                    int* threshold_initialized) {
  int i = kBandFirst;
  uint32_t out = 0;
  const float kScale = 1 / 64.0;

  if (!(*threshold_initialized)) {
    // Set the |threshold_spectrum| to half the input |spectrum| as starting
    // value. This speeds up the convergence.
    for (i = kBandFirst; i <= kBandLast; i++) {
      if (spectrum[i] > 0.0f) {
        threshold_spectrum[i].float_ = (spectrum[i] / 2);
        *threshold_initialized = 1;
      }
    }
  }

  for (i = kBandFirst; i <= kBandLast; i++) {
    // Update the |threshold_spectrum|.
    MeanEstimatorFloat(spectrum[i], kScale, &(threshold_spectrum[i].float_));
    // Convert |spectrum| at current frequency bin to a binary value.
    if (spectrum[i] > threshold_spectrum[i].float_) {
      out = SetBit(out, i - kBandFirst);
    }
  }

  return out;
}